

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestRequiredMessage::_InternalSerialize
          (TestRequiredMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestRequired *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  RepeatedPtrField<proto2_unittest::TestRequired> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  TestRequired *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestRequiredMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestRequiredMessage *this_local;
  
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar6;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    pTVar2 = (this->field_0)._impl_.optional_message_;
    iVar4 = TestRequired::GetCachedSize((this->field_0)._impl_.optional_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)pTVar2,iVar4,target,stream);
  }
  local_30 = 0;
  uVar5 = _internal_repeated_message_size(this);
  for (; local_30 < uVar5; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_message(this);
    this_01 = google::protobuf::RepeatedPtrField<proto2_unittest::TestRequired>::Get
                        (this_00,local_30);
    iVar4 = TestRequired::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar4,(uint8_t *)stream_local,stream);
  }
  if ((uVar1 & 2) != 0) {
    pTVar2 = (this->field_0)._impl_.required_message_;
    iVar4 = TestRequired::GetCachedSize((this->field_0)._impl_.required_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)pTVar2,iVar4,(uint8_t *)stream_local,stream);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRequiredMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestRequired optional_message = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestRequired repeated_message = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .proto2_unittest.TestRequired required_message = 3 [features = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.required_message_, this_._impl_.required_message_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRequiredMessage)
  return target;
}